

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void ActionUnserialize::
     SerReadWriteMany<SpanReader,std::__cxx11::string&,unsigned_long&,int&,int&,int&>
               (SpanReader *s,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               unsigned_long *args_1,int *args_2,int *args_3,int *args_4)

{
  int *__nbytes;
  long in_FS_OFFSET;
  uint64_t obj;
  int local_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = args_2;
  Unserialize<SpanReader,char>(s,args);
  SpanReader::read(s,(int)&local_40,&DAT_00000008,(size_t)__nbytes);
  *args_1 = CONCAT44(uStack_3c,local_40);
  SpanReader::read(s,(int)&local_40,(void *)0x4,(size_t)__nbytes);
  *args_2 = local_40;
  SpanReader::read(s,(int)&local_40,(void *)0x4,(size_t)__nbytes);
  *args_3 = local_40;
  SpanReader::read(s,(int)&local_40,(void *)0x4,(size_t)__nbytes);
  *args_4 = local_40;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }